

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderDiscardTests.cpp
# Opt level: O0

ShaderDiscardCase *
deqp::gles2::Functional::makeDiscardCase(Context *context,DiscardTemplate tmpl,DiscardMode mode)

{
  char *pcVar1;
  mapped_type *pmVar2;
  ShaderDiscardCase *this;
  char *description_00;
  char *shaderSource;
  ShaderEvalFunc evalFunc;
  string local_258;
  deUint32 local_238;
  allocator<char> local_231;
  deUint32 flags;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 local_1f0 [8];
  string description;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_188 [8];
  string name;
  key_type local_160;
  allocator<char> local_139;
  key_type local_138;
  allocator<char> local_111;
  key_type local_110;
  allocator<char> local_e9;
  key_type local_e8;
  allocator<char> local_c1;
  key_type local_c0;
  undefined1 local_a0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  StringTemplate shaderTemplate;
  DiscardMode mode_local;
  DiscardTemplate tmpl_local;
  Context *context_local;
  
  shaderTemplate.m_template.field_2._8_4_ = mode;
  shaderTemplate.m_template.field_2._12_4_ = tmpl;
  pcVar1 = getTemplate(tmpl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,pcVar1,&local_59);
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_a0);
  switch(shaderTemplate.m_template.field_2._8_4_) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"DISCARD",&local_c1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_a0,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar2,"discard");
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"DISCARD",&local_e9);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_a0,&local_e8);
    std::__cxx11::string::operator=((string *)pmVar2,"if (false) discard");
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"DISCARD",&local_111);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_a0,&local_110);
    std::__cxx11::string::operator=((string *)pmVar2,"if (ui_one > 0) discard");
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"DISCARD",&local_139);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_a0,&local_138);
    std::__cxx11::string::operator=((string *)pmVar2,"if (v_coords.x+v_coords.y > 0.0) discard");
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator(&local_139);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"DISCARD",(allocator<char> *)(name.field_2._M_local_buf + 0xf));
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_a0,&local_160);
    std::__cxx11::string::operator=
              ((string *)pmVar2,"if (texture2D(ut_brick, v_coords.xy*0.25+0.5).x < 0.7) discard");
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
  }
  pcVar1 = getTemplateName(shaderTemplate.m_template.field_2._12_4_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,pcVar1,(allocator<char> *)(description.field_2._M_local_buf + 0xf)
            );
  std::operator+(&local_1a8,&local_1c8,"_");
  pcVar1 = getModeName(shaderTemplate.m_template.field_2._8_4_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                 &local_1a8,pcVar1);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)(description.field_2._M_local_buf + 0xf));
  pcVar1 = getModeDesc(shaderTemplate.m_template.field_2._8_4_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&flags,pcVar1,&local_231);
  std::operator+(&local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags," in ")
  ;
  pcVar1 = getTemplateDesc(shaderTemplate.m_template.field_2._12_4_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                 &local_210,pcVar1);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&flags);
  std::allocator<char>::~allocator(&local_231);
  local_238 = (uint)(shaderTemplate.m_template.field_2._8_4_ == 4) +
              (uint)(shaderTemplate.m_template.field_2._12_4_ == 3) * 2;
  this = (ShaderDiscardCase *)operator_new(0x138);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  description_00 = (char *)std::__cxx11::string::c_str();
  tcu::StringTemplate::specialize
            (&local_258,(StringTemplate *)local_38,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_a0);
  shaderSource = (char *)std::__cxx11::string::c_str();
  evalFunc = getEvalFunc(shaderTemplate.m_template.field_2._8_4_);
  ShaderDiscardCase::ShaderDiscardCase
            (this,context,pcVar1,description_00,shaderSource,evalFunc,local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::string::~string((string *)local_188);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_a0);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_38);
  return this;
}

Assistant:

ShaderDiscardCase* makeDiscardCase (Context& context, DiscardTemplate tmpl, DiscardMode mode)
{
	StringTemplate shaderTemplate(getTemplate(tmpl));

	map<string, string> params;

	switch (mode)
	{
		case DISCARDMODE_ALWAYS:	params["DISCARD"] = "discard";										break;
		case DISCARDMODE_NEVER:		params["DISCARD"] = "if (false) discard";							break;
		case DISCARDMODE_UNIFORM:	params["DISCARD"] = "if (ui_one > 0) discard";						break;
		case DISCARDMODE_DYNAMIC:	params["DISCARD"] = "if (v_coords.x+v_coords.y > 0.0) discard";		break;
		case DISCARDMODE_TEXTURE:	params["DISCARD"] = "if (texture2D(ut_brick, v_coords.xy*0.25+0.5).x < 0.7) discard";	break;
		default:
			DE_ASSERT(DE_FALSE);
			break;
	}

	string		name			= string(getTemplateName(tmpl)) + "_" + getModeName(mode);
	string		description		= string(getModeDesc(mode)) + " in " + getTemplateDesc(tmpl);
	deUint32	flags			= (mode == DISCARDMODE_TEXTURE ? FLAG_USES_TEXTURES : 0)
								| (tmpl == DISCARDTEMPLATE_MAIN_DYNAMIC_LOOP ? FLAG_REQUIRES_DYNAMIC_LOOPS : 0);

	return new ShaderDiscardCase(context, name.c_str(), description.c_str(), shaderTemplate.specialize(params).c_str(), getEvalFunc(mode), flags);
}